

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::matchElementValue
          (ASTContext *context,Type *elementType,FieldSymbol *targetField,SourceRange sourceRange,
          span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
          typeSetters,Expression *defaultSetter)

{
  Compilation *pCVar1;
  ConstantRange CVar2;
  undefined1 auVar3 [16];
  SourceRange sourceRange_00;
  Symbol *defaultSetter_00;
  pointer targetField_00;
  bool bVar4;
  int iVar5;
  Type *pTVar6;
  ConstantRange CVar7;
  Expression *pEVar8;
  Diagnostic *this;
  undefined4 extraout_var;
  SimpleAssignmentPatternExpression *pSVar9;
  undefined4 extraout_var_00;
  specific_symbol_iterator<slang::ast::FieldSymbol> extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  ulong uVar11;
  not_null<const_slang::ast::Type_*> rhs;
  long lVar12;
  FieldSymbol *pFVar13;
  FieldSymbol *field;
  SourceLocation lhs;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar14;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  Expression *elemExpr;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin3;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  bool local_b9;
  ASTContext *local_b8;
  undefined1 local_b0 [32];
  SourceLocation local_90;
  Symbol *local_88;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_80;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar10;
  
  sourceRange_03.startLoc = sourceRange.startLoc;
  rhs.ptr = elementType;
  local_b8 = context;
  local_b0._24_8_ = sourceRange_03.startLoc;
  local_90 = sourceRange.endLoc;
  bVar4 = Type::isError(elementType);
  if (bVar4) {
LAB_00433f71:
    pSVar9 = (SimpleAssignmentPatternExpression *)0x0;
  }
  else {
    pEVar8 = (Expression *)0x0;
    local_b0._8_8_ = sourceRange.endLoc;
    local_b0._16_8_ = targetField;
    local_88 = (Symbol *)defaultSetter;
    for (lVar12 = 0; defaultSetter_00 = local_88,
        typeSetters._M_extent._M_extent_value << 4 != lVar12; lVar12 = lVar12 + 0x10) {
      rhs.ptr = *(Type **)((long)&((typeSetters._M_ptr)->type).ptr + lVar12);
      if ((rhs.ptr != (Type *)0x0) && (bVar4 = Type::isMatching(elementType,rhs.ptr), bVar4)) {
        pEVar8 = *(Expression **)((long)&((typeSetters._M_ptr)->expr).ptr + lVar12);
      }
    }
    if (pEVar8 != (Expression *)0x0) {
      return pEVar8;
    }
    if (local_88 == (Symbol *)0x0) {
      lhs = (SourceLocation)0x0;
      pFVar13 = (FieldSymbol *)local_b0._16_8_;
    }
    else {
      rhs.ptr = (Type *)(local_88->name)._M_len;
      lhs = local_88->location;
      bVar4 = Type::isMatching(elementType,rhs.ptr);
      pFVar13 = (FieldSymbol *)local_b0._16_8_;
      if (bVar4) {
        return (Expression *)defaultSetter_00;
      }
      bVar4 = Type::isSimpleBitVector(elementType);
      if (bVar4) {
        rhs.ptr = (Type *)(defaultSetter_00->name)._M_len;
        bVar4 = Type::isAssignmentCompatible(elementType,rhs.ptr);
        if (bVar4) goto LAB_004341d2;
      }
    }
    bVar4 = Type::isStruct(elementType);
    if (bVar4) {
      bVar4 = Type::isUnpackedStruct(elementType);
      pTVar6 = Type::getCanonicalType(elementType);
      local_70[0].data_ = (pointer)local_70[0].firstElement;
      local_70[0].len = 0;
      local_70[0].cap = 5;
      sVar14 = Scope::membersOfType<slang::ast::FieldSymbol>
                         ((Scope *)(&pTVar6[1].super_Symbol.kind + (ulong)!bVar4 * 2));
      sVar10 = sVar14._M_end.current;
      while( true ) {
        local_80._M_ptr = (pointer)sVar14._M_begin.current;
        targetField_00 = local_80._M_ptr;
        if ((Symbol *)local_80._M_ptr == sVar10.current) break;
        pTVar6 = DeclaredType::getType((DeclaredType *)((long)local_80._M_ptr + 0x40));
        bVar4 = Type::isError(pTVar6);
        if (((bVar4) || (((string_view *)((long)targetField_00 + 8))->_M_len == 0)) ||
           (sourceRange_00.endLoc = local_90,
           sourceRange_00.startLoc = (SourceLocation)local_b0._24_8_,
           local_b0._0_8_ =
                matchElementValue(local_b8,pTVar6,(FieldSymbol *)targetField_00,sourceRange_00,
                                  typeSetters,(Expression *)defaultSetter_00), rhs.ptr = pTVar6,
           (Expression *)local_b0._0_8_ == (Expression *)0x0)) {
          pSVar9 = (SimpleAssignmentPatternExpression *)0x0;
          elementType = rhs.ptr;
          goto LAB_004342cf;
        }
        rhs.ptr = (Type *)local_b0;
        SmallVectorBase<slang::ast::Expression_const*>::
        emplace_back<slang::ast::Expression_const*const&>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,(Expression **)rhs.ptr
                  );
        Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::increment
                  ((specific_symbol_iterator<slang::ast::FieldSymbol> *)&local_80);
        sVar14._M_end.current = extraout_RDX.current;
        sVar14._M_begin.current = (Symbol *)local_80._M_ptr;
      }
      pCVar1 = ((local_b8->scope).ptr)->compilation;
      local_b0._0_8_ = local_b0._0_8_ & 0xffffffffffffff00;
      iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_70,(EVP_PKEY_CTX *)pCVar1,
                         (EVP_PKEY_CTX *)sVar14._M_end.current.current);
      local_80._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
      pSVar9 = BumpAllocator::
               emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                         (&pCVar1->super_BumpAllocator,elementType,(bool *)local_b0,&local_80,
                          (SourceRange *)(local_b0 + 0x18));
    }
    else {
      bVar4 = Type::isArray(elementType);
      if ((!bVar4) || (bVar4 = Type::hasFixedRange(elementType), !bVar4)) {
        if (defaultSetter_00 != (Symbol *)0x0) {
LAB_004341d2:
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_b8;
          pEVar8 = Expression::bindRValue
                             ((Expression *)elementType,(Type *)lhs,(ExpressionSyntax *)0x0,
                              (SourceRange)(auVar3 << 0x40),(ASTContext *)0x0,
                              (bitmask<slang::ast::ASTFlags>)typeSetters._M_ptr);
          return pEVar8;
        }
        if (pFVar13 == (FieldSymbol *)0x0) {
          sourceRange_02.endLoc = (SourceLocation)local_b0._8_8_;
          sourceRange_02.startLoc = sourceRange_03.startLoc;
          ASTContext::addDiag(local_b8,(DiagCode)0x140007,sourceRange_02);
        }
        else {
          sourceRange_01.endLoc = (SourceLocation)local_b0._8_8_;
          sourceRange_01.startLoc = sourceRange_03.startLoc;
          this = ASTContext::addDiag(local_b8,(DiagCode)0x160007,sourceRange_01);
          Diagnostic::operator<<
                    (this,(pFVar13->super_VariableSymbol).super_ValueSymbol.super_Symbol.name);
          Diagnostic::addNote(this,(DiagCode)0x50001,
                              (pFVar13->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                              location);
        }
        goto LAB_00433f71;
      }
      pTVar6 = Type::getArrayElementType(elementType);
      sourceRange_03.endLoc = (SourceLocation)local_b0._8_8_;
      local_b0._0_8_ =
           matchElementValue(local_b8,pTVar6,(FieldSymbol *)0x0,sourceRange_03,typeSetters,
                             (Expression *)defaultSetter_00);
      if ((Expression *)local_b0._0_8_ == (Expression *)0x0) {
        return (Expression *)0x0;
      }
      local_70[0].data_ = (pointer)local_70[0].firstElement;
      local_70[0].len = 0;
      local_70[0].cap = 5;
      CVar7 = Type::getFixedRange(elementType);
      CVar2 = CVar7;
      if (CVar7.right < CVar7.left) {
        CVar2 = (ConstantRange)((ulong)CVar7 >> 0x20);
      }
      uVar11 = (ulong)CVar2 & 0xffffffff;
      CVar2 = (ConstantRange)((ulong)CVar7 >> 0x20);
      if (CVar7.right < CVar7.left) {
        CVar2 = CVar7;
      }
      src = extraout_RDX_00;
      for (; (int)uVar11 <= CVar2.left; uVar11 = (ulong)((int)uVar11 + 1)) {
        SmallVectorBase<slang::ast::Expression_const*>::
        emplace_back<slang::ast::Expression_const*const&>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,
                   (Expression **)local_b0);
        src = extraout_RDX_01;
      }
      pCVar1 = ((local_b8->scope).ptr)->compilation;
      local_b9 = false;
      iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_70,(EVP_PKEY_CTX *)pCVar1,src);
      local_80._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar5);
      pSVar9 = BumpAllocator::
               emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                         (&pCVar1->super_BumpAllocator,elementType,&local_b9,&local_80,
                          (SourceRange *)(local_b0 + 0x18));
    }
LAB_004342cf:
    SmallVectorBase<const_slang::ast::Expression_*>::cleanup(local_70,(EVP_PKEY_CTX *)elementType);
  }
  return (Expression *)pSVar9;
}

Assistant:

static const Expression* matchElementValue(
    const ASTContext& context, const Type& elementType, const FieldSymbol* targetField,
    SourceRange sourceRange,
    std::span<const StructuredAssignmentPatternExpression::TypeSetter> typeSetters,
    const Expression* defaultSetter) {

    // Every element in the array or structure must be covered by one of:
    // index:value      -- recorded in the indexMap (handled only at the top level, not here)
    // member:value     -- recorded in the memberMap (handled only at the top level, not here)
    // type:value       -- recorded in typeSetters, last one takes precedence
    // default:value    -- recorded in defaultSetter, types must be assignable
    // struct element   -- recursively descend into the struct
    // array element    -- recursively descend into the array

    if (elementType.isError())
        return nullptr;

    // Try all type setters for a match. Last one that matches wins.
    const Expression* found = nullptr;
    for (auto& setter : typeSetters) {
        if (setter.type && elementType.isMatching(*setter.type))
            found = setter.expr;
    }
    if (found)
        return found;

    // Otherwise, see if we have a default value that can be applied.
    // The default applies if:
    // - The element type matches exactly
    // - The element type is a simple bit vector and the type is assignment compatible
    const ExpressionSyntax* defaultSyntax = nullptr;
    if (defaultSetter) {
        defaultSyntax = defaultSetter->syntax;
        SLANG_ASSERT(defaultSyntax);
    }

    if (defaultSetter) {
        if (elementType.isMatching(*defaultSetter->type))
            return defaultSetter;

        if (elementType.isSimpleBitVector() &&
            elementType.isAssignmentCompatible(*defaultSetter->type)) {
            return &Expression::bindRValue(elementType, *defaultSyntax, {}, context);
        }
    }

    // Otherwise, we check first if the type is a struct or array, in which
    // case we descend recursively into its members before continuing on with the default.
    if (elementType.isStruct()) {
        const Scope* structScope;
        if (elementType.isUnpackedStruct())
            structScope = &elementType.getCanonicalType().as<UnpackedStructType>();
        else
            structScope = &elementType.getCanonicalType().as<PackedStructType>();

        SmallVector<const Expression*> elements;
        for (auto& field : structScope->membersOfType<FieldSymbol>()) {
            const Type& type = field.getType();
            if (type.isError() || field.name.empty())
                return nullptr;

            auto elemExpr = matchElementValue(context, type, &field, sourceRange, typeSetters,
                                              defaultSetter);
            if (!elemExpr)
                return nullptr;

            elements.push_back(elemExpr);
        }

        auto& comp = context.getCompilation();
        return comp.emplace<SimpleAssignmentPatternExpression>(elementType, /* isLValue */ false,
                                                               elements.copy(comp), sourceRange);
    }

    if (elementType.isArray() && elementType.hasFixedRange()) {
        auto nestedElemType = elementType.getArrayElementType();
        SLANG_ASSERT(nestedElemType);

        auto elemExpr = matchElementValue(context, *nestedElemType, nullptr, sourceRange,
                                          typeSetters, defaultSetter);
        if (!elemExpr)
            return nullptr;

        SmallVector<const Expression*> elements;
        auto arrayRange = elementType.getFixedRange();
        for (int32_t i = arrayRange.lower(); i <= arrayRange.upper(); i++)
            elements.push_back(elemExpr);

        auto& comp = context.getCompilation();
        return comp.emplace<SimpleAssignmentPatternExpression>(elementType, /* isLValue */ false,
                                                               elements.copy(comp), sourceRange);
    }

    // Finally, if we have a default then it must now be assignment compatible.
    if (defaultSetter)
        return &Expression::bindRValue(elementType, *defaultSyntax, {}, context);

    // Otherwise there's no setter for this element, which is an error.
    if (targetField) {
        auto& diag = context.addDiag(diag::AssignmentPatternNoMember, sourceRange);
        diag << targetField->name;
        diag.addNote(diag::NoteDeclarationHere, targetField->location);
    }
    else {
        context.addDiag(diag::AssignmentPatternMissingElements, sourceRange);
    }

    return nullptr;
}